

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_stable_pack(REF_GRID ref_grid)

{
  uint uVar1;
  long lVar2;
  REF_INT *o2n;
  REF_INT *n2o;
  REF_INT *local_40;
  REF_INT *local_38;
  
  uVar1 = ref_node_synchronize_globals(ref_grid->node);
  if (uVar1 == 0) {
    uVar1 = ref_node_stable_compact(ref_grid->node,&local_40,&local_38);
    if (uVar1 == 0) {
      uVar1 = ref_node_pack(ref_grid->node,local_40,local_38);
      if (uVar1 == 0) {
        lVar2 = 0;
        do {
          uVar1 = ref_cell_pack(ref_grid->cell[lVar2],local_40);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x93,"ref_grid_stable_pack",(ulong)uVar1,"pack cell");
            return uVar1;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x10);
        uVar1 = ref_geom_pack(ref_grid->geom,local_40);
        if (uVar1 == 0) {
          uVar1 = ref_interp_pack(ref_grid->interp,local_38);
          if (uVar1 == 0) {
            if (local_38 != (REF_INT *)0x0) {
              free(local_38);
            }
            uVar1 = 0;
            if (local_40 != (REF_INT *)0x0) {
              free(local_40);
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x97,"ref_grid_stable_pack",(ulong)uVar1,"pack interp");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x96,"ref_grid_stable_pack",(ulong)uVar1,"pack geom");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x91
               ,"ref_grid_stable_pack",(ulong)uVar1,"pack node");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x90,
             "ref_grid_stable_pack",(ulong)uVar1,"pack node");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x8d,
           "ref_grid_stable_pack",(ulong)uVar1,"sync globals");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_grid_stable_pack(REF_GRID ref_grid) {
  REF_INT group;
  REF_INT *o2n, *n2o;
  REF_CELL ref_cell;

  RSS(ref_node_synchronize_globals(ref_grid_node(ref_grid)), "sync globals");

  RSS(ref_node_stable_compact(ref_grid_node(ref_grid), &o2n, &n2o),
      "pack node");
  RSS(ref_node_pack(ref_grid_node(ref_grid), o2n, n2o), "pack node");
  each_ref_grid_all_ref_cell(ref_grid, group, ref_cell) {
    RSS(ref_cell_pack(ref_cell, o2n), "pack cell");
  }

  RSS(ref_geom_pack(ref_grid_geom(ref_grid), o2n), "pack geom");
  RSS(ref_interp_pack(ref_grid_interp(ref_grid), n2o), "pack interp");

  ref_free(n2o);
  ref_free(o2n);

  return REF_SUCCESS;
}